

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusbar.cpp
# Opt level: O2

int __thiscall
QStatusBar::insertPermanentWidget(QStatusBar *this,int index,QWidget *widget,int stretch)

{
  QStatusBarPrivate *this_00;
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  char local_58 [24];
  char *local_40;
  SBItem local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (widget == (QWidget *)0x0) {
    index = -1;
  }
  else {
    this_00 = *(QStatusBarPrivate **)&(this->super_QWidget).field_0x8;
    local_38.category = Permanent;
    local_38.widget = widget;
    local_38.stretch = stretch;
    iVar2 = QStatusBarPrivate::indexToLastNonPermanentWidget(this_00);
    if (((index < 0) || ((ulong)(this_00->items).d.size < (ulong)(uint)index)) || (index <= iVar2))
    {
      local_58[0] = '\x02';
      local_58[1] = '\0';
      local_58[2] = '\0';
      local_58[3] = '\0';
      local_58[0x14] = '\0';
      local_58[0x15] = '\0';
      local_58[0x16] = '\0';
      local_58[0x17] = '\0';
      local_58[4] = '\0';
      local_58[5] = '\0';
      local_58[6] = '\0';
      local_58[7] = '\0';
      local_58[8] = '\0';
      local_58[9] = '\0';
      local_58[10] = '\0';
      local_58[0xb] = '\0';
      local_58[0xc] = '\0';
      local_58[0xd] = '\0';
      local_58[0xe] = '\0';
      local_58[0xf] = '\0';
      local_58[0x10] = '\0';
      local_58[0x11] = '\0';
      local_58[0x12] = '\0';
      local_58[0x13] = '\0';
      local_40 = "default";
      QMessageLogger::warning
                (local_58,
                 "QStatusBar::insertPermanentWidget: Index out of range (%d), appending widget",
                 (ulong)(uint)index);
      index = (int)(this_00->items).d.size;
    }
    QList<QStatusBarPrivate::SBItem>::emplace<QStatusBarPrivate::SBItem_const&>
              (&this_00->items,(long)index,&local_38);
    reformat(this);
    bVar1 = QWidgetPrivate::isExplicitlyHidden(*(QWidgetPrivate **)&widget->field_0x8);
    if (!bVar1) {
      QWidget::show(widget);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return index;
  }
  __stack_chk_fail();
}

Assistant:

int QStatusBar::insertPermanentWidget(int index, QWidget *widget, int stretch)
{
    if (!widget)
        return -1;

    Q_D(QStatusBar);
    QStatusBarPrivate::SBItem item{widget, stretch, QStatusBarPrivate::Permanent};

    int idx = d->indexToLastNonPermanentWidget();
    if (Q_UNLIKELY(index < 0 || index > d->items.size() || (idx >= 0 && index <= idx))) {
        qWarning("QStatusBar::insertPermanentWidget: Index out of range (%d), appending widget", index);
        index = d->items.size();
    }
    d->items.insert(index, item);

    reformat();
    if (!QWidgetPrivate::get(widget)->isExplicitlyHidden())
        widget->show();

    return index;
}